

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSeq.c
# Opt level: O2

void Sim_SimulateSeqFrame(Vec_Ptr_t *vInfo,Abc_Ntk_t *pNtk,int iFrames,int nWords,int fTransfer)

{
  Abc_Obj_t *pAVar1;
  int nOffset;
  int iVar2;
  
  nOffset = iFrames * nWords;
  for (iVar2 = 0; iVar2 < pNtk->vObjs->nSize; iVar2 = iVar2 + 1) {
    pAVar1 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vObjs,iVar2);
    if ((pAVar1 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar1->field_0x14 & 0xf) == 7)) {
      Sim_UtilSimulateNodeOne(pAVar1,vInfo,nWords,nOffset);
    }
  }
  for (iVar2 = 0; iVar2 < pNtk->vPos->nSize; iVar2 = iVar2 + 1) {
    pAVar1 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vPos,iVar2);
    Sim_UtilTransferNodeOne(pAVar1,vInfo,nWords,nOffset,0);
  }
  if (fTransfer != 0) {
    for (iVar2 = 0; iVar2 < pNtk->vBoxes->nSize; iVar2 = iVar2 + 1) {
      pAVar1 = Abc_NtkBox(pNtk,iVar2);
      if ((*(uint *)&pAVar1->field_0x14 & 0xf) == 8) {
        Sim_UtilTransferNodeOne(pAVar1,vInfo,nWords,nOffset,1);
      }
    }
  }
  return;
}

Assistant:

void Sim_SimulateSeqFrame( Vec_Ptr_t * vInfo, Abc_Ntk_t * pNtk, int iFrames, int nWords, int fTransfer )
{
    Abc_Obj_t * pNode;
    int i;
    Abc_NtkForEachNode( pNtk, pNode, i )
        Sim_UtilSimulateNodeOne( pNode, vInfo, nWords, iFrames * nWords );
    Abc_NtkForEachPo( pNtk, pNode, i )
        Sim_UtilTransferNodeOne( pNode, vInfo, nWords, iFrames * nWords, 0 );
    if ( !fTransfer )
        return;
    Abc_NtkForEachLatch( pNtk, pNode, i )
        Sim_UtilTransferNodeOne( pNode, vInfo, nWords, iFrames * nWords, 1 );
}